

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# genkat.c
# Opt level: O2

void print_tag(void *out,uint32_t outlen)

{
  ulong uVar1;
  
  if (out != (void *)0x0) {
    printf("Tag: ");
    for (uVar1 = 0; outlen != uVar1; uVar1 = uVar1 + 1) {
      printf("%2.2x ",(ulong)*(byte *)((long)out + uVar1));
    }
    putchar(10);
    return;
  }
  return;
}

Assistant:

void print_tag(const void *out, uint32_t outlen) {
    unsigned i;
    if (out != NULL) {
        printf("Tag: ");

        for (i = 0; i < outlen; ++i) {
            printf("%2.2x ", ((uint8_t *)out)[i]);
        }

        printf("\n");
    }
}